

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O2

void __thiscall
HBT_correlation::create_a_2D_array<double>(HBT_correlation *this,double ***arr2D,int nx,int ny)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)nx << 3;
  if (nx < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = (ulong)(uint)nx;
  if (nx < 1) {
    uVar3 = uVar5;
  }
  ppdVar1 = (double **)operator_new__(uVar4);
  *arr2D = ppdVar1;
  uVar4 = (ulong)(uint)ny << 3;
  if (ny < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2 = (double *)operator_new__(uVar4);
    (*arr2D)[uVar5] = pdVar2;
  }
  return;
}

Assistant:

void HBT_correlation::create_a_2D_array(T **&arr2D, int nx, int ny) {
    arr2D = new T *[nx];
    for (int i = 0; i < nx; i++) {
        arr2D[i] = new T[ny];
    }
}